

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

NTRUKeyPair * ntru_keygen_attempt(uint p,uint q,uint w)

{
  undefined1 auVar1 [16];
  ulong factor1;
  size_t sVar2;
  short sVar3;
  uint uVar4;
  mp_int *pmVar5;
  uint16_t *in;
  mp_int *r;
  uintmax_t uVar6;
  uint16_t *out;
  uint16_t *v;
  uint16_t *in_00;
  uint16_t *out_00;
  uint16_t *a;
  uint16_t *out_01;
  uint16_t *v_00;
  NTRUKeyPair *pNVar7;
  ulong uVar8;
  short sVar9;
  ulong uVar10;
  uint i;
  
  factor1 = (ulong)p;
  uVar8 = (ulong)(p * 2 + 0x80);
  pmVar5 = mp_random_bits_fn(uVar8,random_read);
  pmVar5 = mp_resize(pmVar5,uVar8 + 0x20);
  in = (uint16_t *)safemalloc(factor1,2,0);
  r = mp_new(0x40);
  if (p != 0) {
    uVar10 = 0;
    do {
      mp_mul_integer_into(pmVar5,pmVar5,3);
      mp_rshift_fixed_into(r,pmVar5,uVar8);
      mp_reduce_mod_2to(pmVar5,uVar8);
      uVar6 = mp_get_integer(r);
      in[uVar10] = (uint16_t)uVar6;
      uVar10 = uVar10 + 1;
    } while (factor1 != uVar10);
  }
  mp_free(r);
  mp_free(pmVar5);
  out = (uint16_t *)safemalloc(factor1,2,0);
  uVar4 = ntru_ring_invert(out,in,p,3);
  if (uVar4 == 0) {
    smemclr(in,factor1 * 2);
    safefree(in);
  }
  else {
    v = (uint16_t *)safemalloc(factor1,2,0);
    ntru_gen_short(v,p,w);
    sVar3 = (short)q;
    if (p == 0) {
      in_00 = (uint16_t *)safemalloc(factor1,2,0);
    }
    else {
      uVar8 = 0;
      do {
        v[uVar8] = (v[uVar8] >> 1) * (sVar3 + -3) + v[uVar8];
        uVar8 = uVar8 + 1;
      } while (factor1 != uVar8);
      uVar8 = 0;
      in_00 = (uint16_t *)safemalloc(factor1,2,0);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (ulong)q & 0xffff;
      do {
        sVar9 = (short)((ulong)v[uVar8] * 3) -
                (short)((ulong)v[uVar8] * 3 *
                        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / auVar1,0) >> 0x30)
                * sVar3;
        uVar4 = q;
        if ((short)(sVar9 - sVar3) < 0) {
          uVar4 = 0;
        }
        in_00[uVar8] = sVar9 - (short)uVar4;
        uVar8 = uVar8 + 1;
      } while (factor1 != uVar8);
    }
    out_00 = (uint16_t *)safemalloc(factor1,2,0);
    uVar4 = ntru_ring_invert(out_00,in_00,p,q);
    if (uVar4 != 0) {
      a = (uint16_t *)safemalloc(factor1,2,0);
      if (p != 0) {
        uVar8 = 0;
        do {
          a[uVar8] = (in[uVar8] >> 1) * (sVar3 + -3) + in[uVar8];
          uVar8 = uVar8 + 1;
        } while (factor1 != uVar8);
      }
      out_01 = (uint16_t *)safemalloc(factor1,2,0);
      ntru_ring_multiply(out_01,a,out_00,p,q);
      v_00 = (uint16_t *)safemalloc(factor1,2,0);
      ntru_gen_short(v_00,p,w);
      pNVar7 = (NTRUKeyPair *)safemalloc(1,0x30,0);
      pNVar7->p = p;
      pNVar7->q = q;
      pNVar7->w = w;
      pNVar7->h = out_01;
      pNVar7->f3 = in_00;
      pNVar7->ginv = out;
      pNVar7->rho = v_00;
      sVar2 = factor1 * 2;
      smemclr(v,sVar2);
      safefree(v);
      smemclr(out_00,sVar2);
      safefree(out_00);
      smemclr(in,sVar2);
      safefree(in);
      smemclr(a,sVar2);
      out = a;
      goto LAB_001308da;
    }
    sVar2 = factor1 * 2;
    smemclr(v,sVar2);
    safefree(v);
    smemclr(in_00,sVar2);
    safefree(in_00);
    smemclr(out_00,sVar2);
    safefree(out_00);
    smemclr(in,sVar2);
    safefree(in);
  }
  smemclr(out,factor1 * 2);
  pNVar7 = (NTRUKeyPair *)0x0;
LAB_001308da:
  safefree(out);
  return pNVar7;
}

Assistant:

NTRUKeyPair *ntru_keygen_attempt(unsigned p, unsigned q, unsigned w)
{
    /*
     * First invent g, which is the one more likely to fail to invert.
     * This is simply a uniformly random polynomial with p terms over
     * Z_3. So we need p*log2(3) random bits for it, plus 128 for
     * uniformity. It's easiest to bound log2(3) above by 2.
     */
    size_t randbitpos = 2 * p + 128;
    mp_int *randdata = mp_resize(mp_random_bits(randbitpos), randbitpos + 32);

    /*
     * Select p random values from {0,1,2}.
     */
    uint16_t *g = snewn(p, uint16_t);
    mp_int *x = mp_new(64);
    for (size_t i = 0; i < p; i++) {
        mp_mul_integer_into(randdata, randdata, 3);
        mp_rshift_fixed_into(x, randdata, randbitpos);
        mp_reduce_mod_2to(randdata, randbitpos);
        g[i] = mp_get_integer(x);
    }
    mp_free(x);
    mp_free(randdata);

    /*
     * Try to invert g over Z_3, and fail if it isn't invertible.
     */
    uint16_t *ginv = snewn(p, uint16_t);
    if (!ntru_ring_invert(ginv, g, p, 3)) {
        ring_free(g, p);
        ring_free(ginv, p);
        return NULL;
    }

    /*
     * Fine; we have g. Now make up an f, and convert it to a
     * polynomial over q.
     */
    uint16_t *f = snewn(p, uint16_t);
    ntru_gen_short(f, p, w);
    ntru_expand(f, f, p, q);

    /*
     * Multiply f by 3.
     */
    uint16_t *f3 = snewn(p, uint16_t);
    ntru_scale(f3, f, 3, p, q);

    /*
     * Try to invert 3*f over Z_q. This should be _almost_ guaranteed
     * to succeed, since Z_q/<x^p-x-1> is a field, so the only
     * non-invertible value is 0. Even so, there _is_ one, so check
     * the return value!
     */
    uint16_t *f3inv = snewn(p, uint16_t);
    if (!ntru_ring_invert(f3inv, f3, p, q)) {
        ring_free(f, p);
        ring_free(f3, p);
        ring_free(f3inv, p);
        ring_free(g, p);
        ring_free(ginv, p);
        return NULL;
    }

    /*
     * Make the public key, by converting g to a polynomial over q and
     * then multiplying by f3inv.
     */
    uint16_t *g_q = snewn(p, uint16_t);
    ntru_expand(g_q, g, p, q);
    uint16_t *h = snewn(p, uint16_t);
    ntru_ring_multiply(h, g_q, f3inv, p, q);

    /*
     * Make up rho, used to substitute for the plaintext in the
     * session hash in case of confirmation failure.
     */
    uint16_t *rho = snewn(p, uint16_t);
    ntru_gen_short(rho, p, w);

    /*
     * And we're done! Free everything except the pieces we're
     * returning.
     */
    NTRUKeyPair *keypair = snew(NTRUKeyPair);
    keypair->p = p;
    keypair->q = q;
    keypair->w = w;
    keypair->h = h;
    keypair->f3 = f3;
    keypair->ginv = ginv;
    keypair->rho = rho;
    ring_free(f, p);
    ring_free(f3inv, p);
    ring_free(g, p);
    ring_free(g_q, p);
    return keypair;
}